

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# muhash.h
# Opt level: O3

void __thiscall
MuHash3072::SerializationOps<DataStream,MuHash3072,ActionUnserialize>
          (MuHash3072 *this,DataStream *obj,undefined8 param_3,size_t param_4)

{
  long lVar1;
  long in_FS_OFFSET;
  uint64_t obj_1;
  undefined8 local_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = 0;
  do {
    DataStream::read(obj,(int)&local_30,&DAT_00000008,param_4);
    *(undefined8 *)((long)(this->m_numerator).limbs + lVar1) = local_30;
    lVar1 = lVar1 + 8;
  } while (lVar1 != 0x180);
  lVar1 = -0x180;
  do {
    DataStream::read(obj,(int)&local_30,&DAT_00000008,param_4);
    *(undefined8 *)((long)this[1].m_numerator.limbs + lVar1) = local_30;
    lVar1 = lVar1 + 8;
  } while (lVar1 != 0);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

SERIALIZE_METHODS(MuHash3072, obj)
    {
        READWRITE(obj.m_numerator);
        READWRITE(obj.m_denominator);
    }